

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputerPlayer.cpp
# Opt level: O2

Card * __thiscall ComputerPlayer::theGreatestAvailable(ComputerPlayer *this)

{
  Card *this_00;
  bool bVar1;
  Deal *this_01;
  Contract *c;
  pointer ppCVar2;
  Card *rhs;
  
  ppCVar2 = (this->available_cards).super__Vector_base<Card_*,_std::allocator<Card_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = *ppCVar2;
  while (rhs = this_00, ppCVar2 = ppCVar2 + 1,
        ppCVar2 !=
        (this->available_cards).super__Vector_base<Card_*,_std::allocator<Card_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
    this_00 = *ppCVar2;
    this_01 = Game::getCurrentDeal((this->super_Player)._game);
    c = Deal::getContract(this_01);
    bVar1 = Card::isBigger(this_00,rhs,c);
    if (!bVar1) {
      this_00 = rhs;
    }
  }
  return rhs;
}

Assistant:

Card *ComputerPlayer::theGreatestAvailable() {
    vector<Card *>::iterator it = available_cards.begin();
    Card *greatest = *it;

    //greatest Card in available cards
    Card *tmp = *it;
    for (++it; it != available_cards.end(); ++it) {
        tmp = *it;
        if (tmp->isBigger(greatest, _game->getCurrentDeal()->getContract()))
            greatest = tmp;
        //std::cout << ' ' << greatest->getValue() << '\n';
    }

    return greatest;
}